

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_options.h
# Opt level: O3

void __thiscall
draco::EncoderOptionsBase<draco::GeometryAttribute::Type>::SetSpeed
          (EncoderOptionsBase<draco::GeometryAttribute::Type> *this,int encoding_speed,
          int decoding_speed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"encoding_speed","");
  Options::SetInt((Options *)this,&local_40,encoding_speed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"decoding_speed","");
  Options::SetInt((Options *)this,&local_40,decoding_speed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SetSpeed(int encoding_speed, int decoding_speed) {
    this->SetGlobalInt("encoding_speed", encoding_speed);
    this->SetGlobalInt("decoding_speed", decoding_speed);
  }